

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JP2K.cpp
# Opt level: O0

MXFReader * __thiscall AS_02::JP2K::MXFReader::FillWriterInfo(MXFReader *this,WriterInfo *Info)

{
  h__Reader *phVar1;
  ulong uVar2;
  WriterInfo *in_RDX;
  WriterInfo *Info_local;
  MXFReader *this_local;
  
  phVar1 = ASDCP::mem_ptr::operator_cast_to_h__Reader_((mem_ptr *)(Info->ProductUUID + 8));
  if (phVar1 != (h__Reader *)0x0) {
    phVar1 = ASDCP::mem_ptr<AS_02::JP2K::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::JP2K::MXFReader::h__Reader> *)(Info->ProductUUID + 8));
    uVar2 = (**(code **)(*(long *)(phVar1->super_h__AS02Reader).
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>
                                  .m_File + 0x40))();
    if ((uVar2 & 1) != 0) {
      phVar1 = ASDCP::mem_ptr<AS_02::JP2K::MXFReader::h__Reader>::operator->
                         ((mem_ptr<AS_02::JP2K::MXFReader::h__Reader> *)(Info->ProductUUID + 8));
      ASDCP::WriterInfo::operator=
                (in_RDX,&(phVar1->super_h__AS02Reader).
                         super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                         m_Info);
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
      return this;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

Result_t
AS_02::JP2K::MXFReader::FillWriterInfo(WriterInfo& Info) const
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    {
      Info = m_Reader->m_Info;
      return RESULT_OK;
    }

  return RESULT_INIT;
}